

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctrsv.c
# Opt level: O2

void ctrsv_(char *uplo,char *trans,char *diag,integer *n,singlecomplex *a,integer *lda,
           singlecomplex *x,integer *incx)

{
  undefined8 uVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  float *pfVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  integer iVar13;
  ulong uVar14;
  ulong uVar15;
  singlecomplex *psVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  float fVar22;
  singlecomplex in_XMM0_Qa;
  float fVar23;
  float fVar24;
  singlecomplex sVar25;
  singlecomplex sVar26;
  singlecomplex sVar27;
  singlecomplex sVar28;
  float fVar29;
  singlecomplex local_98;
  singlecomplex local_90;
  uint local_84;
  singlecomplex local_80;
  ulong local_78;
  integer info;
  singlecomplex q__3;
  
  info = 0;
  cVar2 = *uplo;
  if ((cVar2 == 'L') || (cVar2 == 'U')) {
    bVar3 = *trans;
    if ((bVar3 - 0x43 < 0x12) && ((0x20801U >> (bVar3 - 0x43 & 0x1f) & 1) != 0)) {
      bVar4 = *diag;
      if ((bVar4 == 0x4e) || (bVar4 == 0x55)) {
        iVar19 = *n;
        uVar18 = (ulong)iVar19;
        if ((long)uVar18 < 0) {
          info = 4;
        }
        else if (*lda < (int)(iVar19 + (uint)(iVar19 == 0))) {
          info = 6;
        }
        else {
          iVar5 = *incx;
          if (iVar5 != 0) {
            local_84 = (uint)bVar4;
            if (iVar19 == 0) {
              return;
            }
            uVar21 = iVar19 - 1;
            iVar10 = iVar5 * uVar21;
            iVar17 = 1;
            iVar11 = 1 - iVar10;
            if (0 < iVar5) {
              iVar11 = 1;
            }
            local_78 = CONCAT44(local_78._4_4_,iVar11);
            if (bVar3 == 0x4e) {
              if (cVar2 != 'U') {
                if (iVar5 == 1) {
                  iVar19 = 0;
                  for (lVar9 = 1; lVar9 <= (int)uVar18; lVar9 = lVar9 + 1) {
                    psVar16 = x + lVar9 + -1;
                    fVar24 = psVar16->r;
                    sVar26.i = 0.0;
                    sVar26.r = fVar24;
                    if (((fVar24 != 0.0) || (NAN(fVar24))) ||
                       ((x[lVar9 + -1].i != 0.0 || (NAN(x[lVar9 + -1].i))))) {
                      if ((char)local_84 == 'N') {
                        c_div(&local_98,psVar16,a + ((int)lVar9 + -1) * (*lda + 1));
                        *psVar16 = local_98;
                        uVar18 = (ulong)(uint)*n;
                        fVar24 = local_98.i;
                        in_XMM0_Qa = local_80;
                        sVar26 = local_98;
                      }
                      else {
                        fVar24 = x[lVar9 + -1].i;
                      }
                      for (lVar8 = lVar9; local_80 = in_XMM0_Qa, lVar8 < (int)uVar18;
                          lVar8 = lVar8 + 1) {
                        fVar22 = a[*lda * iVar19 + (int)lVar8].r;
                        fVar23 = a[*lda * iVar19 + (int)lVar8].i;
                        in_XMM0_Qa.r = fVar22 * sVar26.r + fVar23 * -fVar24;
                        in_XMM0_Qa.i = fVar23 * sVar26.r + fVar22 * fVar24;
                        local_98.r = x[lVar8].r - in_XMM0_Qa.r;
                        local_98.i = x[lVar8].i - in_XMM0_Qa.i;
                        x[lVar8] = local_98;
                      }
                    }
                    iVar19 = iVar19 + 1;
                  }
                  return;
                }
                for (lVar9 = 1; iVar19 = (int)lVar9, iVar19 <= (int)uVar18; lVar9 = lVar9 + 1) {
                  lVar8 = (long)(int)(uint)local_78;
                  fVar24 = x[lVar8 + -1].r;
                  sVar28.i = 0.0;
                  sVar28.r = fVar24;
                  uVar21 = (uint)local_78;
                  if ((((fVar24 != 0.0) || (NAN(fVar24))) || (x[lVar8 + -1].i != 0.0)) ||
                     (NAN(x[lVar8 + -1].i))) {
                    if ((char)local_84 == 'N') {
                      c_div(&local_98,x + lVar8 + -1,a + (*lda + 1) * (iVar19 + -1));
                      x[lVar8 + -1] = local_98;
                      uVar18 = (ulong)(uint)*n;
                      fVar24 = local_98.i;
                      in_XMM0_Qa = local_80;
                      sVar28 = local_98;
                      uVar21 = (uint)local_78;
                    }
                    else {
                      fVar24 = x[lVar8 + -1].i;
                    }
                    uVar15 = (ulong)uVar21;
                    for (lVar8 = lVar9; (int)lVar8 < (int)uVar18; lVar8 = lVar8 + 1) {
                      uVar15 = (long)(int)uVar15 + (long)*incx;
                      fVar22 = a[(long)*lda * (long)(iVar19 + -1) + lVar8].r;
                      fVar23 = a[(long)*lda * (long)(iVar19 + -1) + lVar8].i;
                      in_XMM0_Qa.r = fVar22 * sVar28.r + fVar23 * -fVar24;
                      in_XMM0_Qa.i = fVar23 * sVar28.r + fVar22 * fVar24;
                      local_98.r = x[uVar15 - 1].r - in_XMM0_Qa.r;
                      local_98.i = x[uVar15 - 1].i - in_XMM0_Qa.i;
                      x[uVar15 - 1] = local_98;
                    }
                    iVar5 = *incx;
                    local_80 = in_XMM0_Qa;
                  }
                  local_78 = CONCAT44(local_78._4_4_,uVar21 + iVar5);
                }
                return;
              }
              if (iVar5 == 1) {
                iVar19 = iVar19 + -2;
                while (0 < (int)uVar18) {
                  uVar18 = uVar18 - 1;
                  psVar16 = x + (uVar18 & 0xffffffff);
                  fVar24 = psVar16->r;
                  sVar25.i = 0.0;
                  sVar25.r = fVar24;
                  if ((((fVar24 != 0.0) || (NAN(fVar24))) || (psVar16->i != 0.0)) ||
                     (NAN(psVar16->i))) {
                    if ((char)local_84 == 'N') {
                      c_div(&local_98,psVar16,a + (*lda + 1) * (int)uVar18);
                      *psVar16 = local_98;
                      fVar24 = local_98.i;
                      in_XMM0_Qa = local_80;
                      sVar25 = local_98;
                    }
                    else {
                      fVar24 = psVar16->i;
                    }
                    iVar5 = iVar19;
                    uVar12 = uVar21;
                    while (local_80 = in_XMM0_Qa, 0 < (int)uVar12) {
                      uVar12 = uVar12 - 1;
                      fVar22 = a[(int)(*lda * uVar21 + iVar5)].r;
                      fVar23 = a[(int)(*lda * uVar21 + iVar5)].i;
                      in_XMM0_Qa.r = fVar22 * sVar25.r + fVar23 * -fVar24;
                      in_XMM0_Qa.i = fVar23 * sVar25.r + fVar22 * fVar24;
                      local_98.r = x[uVar12].r - in_XMM0_Qa.r;
                      local_98.i = x[uVar12].i - in_XMM0_Qa.i;
                      x[uVar12] = local_98;
                      iVar5 = iVar5 + -1;
                    }
                  }
                  uVar21 = uVar21 - 1;
                  iVar19 = iVar19 + -1;
                }
                return;
              }
              local_78 = CONCAT44(local_78._4_4_,iVar11 + iVar10);
              while (iVar19 = (int)uVar18, 0 < iVar19) {
                lVar9 = (long)(int)(uint)local_78;
                fVar24 = x[lVar9 + -1].r;
                sVar27.i = 0.0;
                sVar27.r = fVar24;
                if (((fVar24 != 0.0) || (NAN(fVar24))) ||
                   ((x[lVar9 + -1].i != 0.0 || (NAN(x[lVar9 + -1].i))))) {
                  if ((char)local_84 == 'N') {
                    c_div(&local_98,x + lVar9 + -1,a + (*lda + 1) * (iVar19 + -1));
                    x[lVar9 + -1] = local_98;
                    fVar24 = local_98.i;
                    in_XMM0_Qa = local_80;
                    sVar27 = local_98;
                  }
                  else {
                    fVar24 = x[lVar9 + -1].i;
                  }
                  lVar9 = (long)(iVar19 + -2);
                  uVar14 = (ulong)(uint)local_78;
                  uVar18 = (ulong)(iVar19 - 1U);
                  for (uVar15 = uVar18; 0 < (int)uVar15; uVar15 = (ulong)((int)uVar15 - 1)) {
                    uVar14 = (long)(int)uVar14 - (long)*incx;
                    fVar22 = a[(long)*lda * (long)(int)(iVar19 - 1U) + lVar9].r;
                    fVar23 = a[(long)*lda * (long)(int)(iVar19 - 1U) + lVar9].i;
                    in_XMM0_Qa.r = fVar22 * sVar27.r + fVar23 * -fVar24;
                    in_XMM0_Qa.i = fVar23 * sVar27.r + fVar22 * fVar24;
                    local_98.r = x[uVar14 - 1].r - in_XMM0_Qa.r;
                    local_98.i = x[uVar14 - 1].i - in_XMM0_Qa.i;
                    x[uVar14 - 1] = local_98;
                    lVar9 = lVar9 + -1;
                  }
                  iVar5 = *incx;
                  uVar21 = (uint)local_78;
                  local_80 = in_XMM0_Qa;
                }
                else {
                  uVar18 = (ulong)(iVar19 - 1);
                  uVar21 = (uint)local_78;
                }
                local_78 = CONCAT44(local_78._4_4_,uVar21 - iVar5);
              }
              return;
            }
            if (cVar2 != 'U') {
              if (iVar5 != 1) {
                iVar11 = iVar11 + iVar10;
                local_78 = CONCAT44(local_78._4_4_,iVar11);
                do {
                  iVar19 = (int)uVar18;
                  if (iVar19 < 1) {
                    return;
                  }
                  uVar12 = iVar19 - 1;
                  local_90 = x[(long)iVar11 + -1];
                  iVar13 = *n;
                  iVar17 = (uint)local_78;
                  if (bVar3 == 0x54) {
                    for (; iVar19 < iVar13; iVar13 = iVar13 + -1) {
                      iVar10 = *lda * uVar21 + iVar13 + -1;
                      fVar24 = x[(long)iVar17 + -1].r;
                      fVar22 = x[(long)iVar17 + -1].i;
                      local_80.r = a[iVar10].r * fVar24 + fVar22 * -a[iVar10].i;
                      local_80.i = a[iVar10].r * fVar22 + fVar24 * a[iVar10].i;
                      fVar24 = local_90.i;
                      local_90.r = local_90.r - local_80.r;
                      local_90.i = fVar24 - local_80.i;
                      iVar17 = iVar17 - iVar5;
                      local_98 = local_90;
                    }
                    if ((char)local_84 == 'N') {
                      psVar16 = a + (int)((*lda + 1) * uVar12);
LAB_00118fde:
                      c_div(&local_98,&local_90,psVar16);
                      local_90 = local_98;
                    }
                  }
                  else {
                    for (; iVar19 < iVar13; iVar13 = iVar13 + -1) {
                      r_cnjg(&q__3,a + (int)(*lda * uVar21 + iVar13 + -1));
                      fVar24 = x[(long)iVar17 + -1].r;
                      fVar22 = x[(long)iVar17 + -1].i;
                      local_80.r = q__3.r * fVar24 + -q__3.i * fVar22;
                      local_80.i = q__3.r * fVar22 + q__3.i * fVar24;
                      fVar24 = local_90.i;
                      local_90.r = local_90.r - local_80.r;
                      local_90.i = fVar24 - local_80.i;
                      iVar17 = iVar17 - *incx;
                      local_98 = local_90;
                    }
                    if ((char)local_84 == 'N') {
                      psVar16 = &local_80;
                      r_cnjg(psVar16,a + (int)((*lda + 1) * uVar12));
                      goto LAB_00118fde;
                    }
                  }
                  uVar18 = (ulong)uVar12;
                  x[(long)iVar11 + -1] = local_90;
                  iVar5 = *incx;
                  iVar11 = iVar11 - iVar5;
                  uVar21 = uVar21 - 1;
                } while( true );
              }
              do {
                iVar19 = (int)uVar18;
                if (iVar19 < 1) {
                  return;
                }
                uVar18 = uVar18 - 1;
                uVar15 = uVar18 & 0xffffffff;
                local_90 = x[uVar15];
                uVar12 = *n;
                local_78 = uVar18;
                if (bVar3 == 0x54) {
                  while (uVar20 = uVar12 - 1, iVar19 < (int)uVar12) {
                    iVar5 = *lda * uVar21 + uVar20;
                    fVar24 = x[uVar20].r;
                    fVar22 = x[uVar20].i;
                    local_80.r = a[iVar5].r * fVar24 + fVar22 * -a[iVar5].i;
                    local_80.i = a[iVar5].r * fVar22 + fVar24 * a[iVar5].i;
                    fVar24 = local_90.i;
                    local_90.r = local_90.r - local_80.r;
                    local_90.i = fVar24 - local_80.i;
                    uVar12 = uVar20;
                    local_98 = local_90;
                  }
                  if ((char)local_84 == 'N') {
                    psVar16 = a + (*lda + 1) * (int)uVar18;
LAB_001189f7:
                    c_div(&local_98,&local_90,psVar16);
                    local_78 = uVar18;
                    local_90 = local_98;
                  }
                }
                else {
                  while (uVar18 = local_78, uVar20 = uVar12 - 1, iVar19 < (int)uVar12) {
                    r_cnjg(&q__3,a + (int)(*lda * uVar21 + uVar20));
                    fVar24 = x[uVar20].r;
                    fVar22 = x[uVar20].i;
                    local_80.r = q__3.r * fVar24 + -q__3.i * fVar22;
                    local_80.i = q__3.r * fVar22 + q__3.i * fVar24;
                    fVar24 = local_90.i;
                    local_90.r = local_90.r - local_80.r;
                    local_90.i = fVar24 - local_80.i;
                    uVar12 = uVar20;
                    local_98 = local_90;
                  }
                  if ((char)local_84 == 'N') {
                    psVar16 = &local_80;
                    r_cnjg(psVar16,a + (*lda + 1) * (int)local_78);
                    goto LAB_001189f7;
                  }
                }
                x[uVar15] = local_90;
                uVar21 = uVar21 - 1;
                uVar18 = local_78;
              } while( true );
            }
            if (iVar5 != 1) {
              lVar9 = (long)iVar11;
              iVar19 = 0;
              do {
                if ((int)uVar18 < iVar17) {
                  return;
                }
                local_90 = x[(long)iVar11 + -1];
                if (bVar3 == 0x54) {
                  psVar16 = x + lVar9 + -1;
                  for (lVar8 = 0; iVar19 != (int)lVar8; lVar8 = lVar8 + 1) {
                    lVar7 = (long)*lda * (long)iVar19 + lVar8;
                    fVar24 = (*psVar16).r;
                    fVar22 = (*psVar16).i;
                    local_80.r = a[lVar7].r * fVar24 + fVar22 * -a[lVar7].i;
                    local_80.i = a[lVar7].r * fVar22 + fVar24 * a[lVar7].i;
                    fVar24 = local_90.i;
                    local_90.r = local_90.r - local_80.r;
                    local_90.i = fVar24 - local_80.i;
                    psVar16 = psVar16 + iVar5;
                    local_98 = local_90;
                  }
                  if ((char)local_84 == 'N') {
                    psVar16 = a + (*lda + 1) * (iVar17 + -1);
LAB_00118ce2:
                    c_div(&local_98,&local_90,psVar16);
                    local_90 = local_98;
                  }
                }
                else {
                  iVar5 = (uint)local_78;
                  for (lVar8 = 0; iVar19 != (int)lVar8; lVar8 = lVar8 + 1) {
                    r_cnjg(&q__3,a + (long)*lda * (long)iVar19 + lVar8);
                    fVar24 = x[(long)iVar5 + -1].r;
                    fVar22 = x[(long)iVar5 + -1].i;
                    local_80.r = q__3.r * fVar24 + -q__3.i * fVar22;
                    local_80.i = q__3.r * fVar22 + q__3.i * fVar24;
                    fVar24 = local_90.i;
                    local_90.r = local_90.r - local_80.r;
                    local_90.i = fVar24 - local_80.i;
                    iVar5 = iVar5 + *incx;
                    local_98 = local_90;
                  }
                  if ((char)local_84 == 'N') {
                    r_cnjg(&local_80,a + (*lda + 1) * (iVar17 + -1));
                    psVar16 = &local_80;
                    goto LAB_00118ce2;
                  }
                }
                x[(long)iVar11 + -1] = local_90;
                iVar5 = *incx;
                iVar11 = iVar11 + iVar5;
                iVar17 = iVar17 + 1;
                uVar18 = (ulong)(uint)*n;
                iVar19 = iVar19 + 1;
              } while( true );
            }
            local_78 = 1;
            lVar8 = 0;
            lVar9 = 0;
            do {
              if ((long)(int)uVar18 < (long)local_78) {
                return;
              }
              iVar19 = (int)local_78 + -1;
              local_90 = x[local_78 + -1];
              if (bVar3 == 0x54) {
                pfVar6 = &a->i;
                for (lVar7 = 4; lVar7 + lVar8 != 4; lVar7 = lVar7 + 8) {
                  fVar24 = *(float *)((long)pfVar6 + *lda * lVar9 + -4);
                  fVar22 = *(float *)((long)pfVar6 + *lda * lVar9);
                  uVar1 = *(undefined8 *)((long)x + lVar7 + -4);
                  fVar23 = (float)uVar1;
                  fVar29 = (float)((ulong)uVar1 >> 0x20);
                  local_80.r = fVar24 * fVar23 + fVar29 * -fVar22;
                  local_80.i = fVar24 * fVar29 + fVar23 * fVar22;
                  fVar24 = local_90.i;
                  local_90.r = local_90.r - local_80.r;
                  local_90.i = fVar24 - local_80.i;
                  pfVar6 = pfVar6 + 2;
                  local_98 = local_90;
                }
                if ((char)local_84 == 'N') {
                  psVar16 = a + iVar19 * (*lda + 1);
LAB_0011874f:
                  c_div(&local_98,&local_90,psVar16);
                  local_90 = local_98;
                }
              }
              else {
                for (lVar7 = 0; lVar9 != lVar7; lVar7 = lVar7 + 8) {
                  r_cnjg(&q__3,(singlecomplex *)((long)&a->r + lVar7 + *lda * lVar9));
                  uVar1 = *(undefined8 *)((long)&x->r + lVar7);
                  fVar24 = (float)uVar1;
                  fVar22 = (float)((ulong)uVar1 >> 0x20);
                  local_80.r = q__3.r * fVar24 + -q__3.i * fVar22;
                  local_80.i = q__3.r * fVar22 + q__3.i * fVar24;
                  fVar24 = local_90.i;
                  local_90.r = local_90.r - local_80.r;
                  local_90.i = fVar24 - local_80.i;
                  local_98 = local_90;
                }
                if ((char)local_84 == 'N') {
                  psVar16 = &local_80;
                  r_cnjg(psVar16,a + iVar19 * (*lda + 1));
                  goto LAB_0011874f;
                }
              }
              x[local_78 + -1] = local_90;
              local_78 = local_78 + 1;
              uVar18 = (ulong)(uint)*n;
              lVar9 = lVar9 + 8;
              lVar8 = lVar8 + -8;
            } while( true );
          }
          info = 8;
        }
      }
      else {
        info = 3;
      }
    }
    else {
      info = 2;
    }
  }
  else {
    info = 1;
  }
  input_error("CTRSV ",&info);
  return;
}

Assistant:

void ctrsv_(char *uplo, char *trans, char *diag, integer *n, 
	singlecomplex *a, integer *lda, singlecomplex *x, integer *incx)
{


    /* System generated locals */

    singlecomplex q__1, q__2, q__3;

    /* Builtin functions */
    void c_div(singlecomplex *, singlecomplex *, singlecomplex *), r_cnjg(singlecomplex *, singlecomplex *);

    /* Local variables */
    integer info;
    singlecomplex temp;
    integer i, j;
    integer ix, jx, kx;
    logical noconj, nounit;

    extern int input_error(char *, int *);

/*  Purpose   
    =======   

    CTRSV  solves one of the systems of equations   

       A*x = b,   or   A'*x = b,   or   conjg( A' )*x = b,   

    where b and x are n element vectors and A is an n by n unit, or   
    non-unit, upper or lower triangular matrix.   

    No test for singularity or near-singularity is included in this   
    routine. Such tests must be performed before calling this routine.   

    Parameters   
    ==========   

    UPLO   - CHARACTER*1.   
             On entry, UPLO specifies whether the matrix is an upper or   
             lower triangular matrix as follows:   

                UPLO = 'U' or 'u'   A is an upper triangular matrix.   

                UPLO = 'L' or 'l'   A is a lower triangular matrix.   

             Unchanged on exit.   

    TRANS  - CHARACTER*1.   
             On entry, TRANS specifies the equations to be solved as   
             follows:   

                TRANS = 'N' or 'n'   A*x = b.   

                TRANS = 'T' or 't'   A'*x = b.   

                TRANS = 'C' or 'c'   conjg( A' )*x = b.   

             Unchanged on exit.   

    DIAG   - CHARACTER*1.   
             On entry, DIAG specifies whether or not A is unit   
             triangular as follows:   

                DIAG = 'U' or 'u'   A is assumed to be unit triangular.   

                DIAG = 'N' or 'n'   A is not assumed to be unit   
                                    triangular.   

             Unchanged on exit.   

    N      - INTEGER.   
             On entry, N specifies the order of the matrix A.   
             N must be at least zero.   
             Unchanged on exit.   

    A      - COMPLEX          array of DIMENSION ( LDA, n ).   
             Before entry with  UPLO = 'U' or 'u', the leading n by n   
             upper triangular part of the array A must contain the upper 
  
             triangular matrix and the strictly lower triangular part of 
  
             A is not referenced.   
             Before entry with UPLO = 'L' or 'l', the leading n by n   
             lower triangular part of the array A must contain the lower 
  
             triangular matrix and the strictly upper triangular part of 
  
             A is not referenced.   
             Note that when  DIAG = 'U' or 'u', the diagonal elements of 
  
             A are not referenced either, but are assumed to be unity.   
             Unchanged on exit.   

    LDA    - INTEGER.   
             On entry, LDA specifies the first dimension of A as declared 
  
             in the calling (sub) program. LDA must be at least   
             max( 1, n ).   
             Unchanged on exit.   

    X      - COMPLEX          array of dimension at least   
             ( 1 + ( n - 1 )*abs( INCX ) ).   
             Before entry, the incremented array X must contain the n   
             element right-hand side vector b. On exit, X is overwritten 
  
             with the solution vector x.   

    INCX   - INTEGER.   
             On entry, INCX specifies the increment for the elements of   
             X. INCX must not be zero.   
             Unchanged on exit.   


    Level 2 Blas routine.   

    -- Written on 22-October-1986.   
       Jack Dongarra, Argonne National Lab.   
       Jeremy Du Croz, Nag Central Office.   
       Sven Hammarling, Nag Central Office.   
       Richard Hanson, Sandia National Labs.   



       Test the input parameters.   

    
   Parameter adjustments   
       Function Body */
#define X(I) x[(I)-1]

#define A(I,J) a[(I)-1 + ((J)-1)* ( *lda)]

    info = 0;
    if ( strncmp(uplo, "U", 1)!=0 && strncmp(uplo, "L", 1)!=0 ) {
	info = 1;
    } else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 &&
		strncmp(trans, "C", 1)!=0 ) {
	info = 2;
    } else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 ) {
	info = 3;
    } else if (*n < 0) {
	info = 4;
    } else if (*lda < max(1,*n)) {
	info = 6;
    } else if (*incx == 0) {
	info = 8;
    }
    if (info != 0) {
	input_error("CTRSV ", &info);
	return;
    }

/*     Quick return if possible. */

    if (*n == 0) {
	return;
    }

    noconj = (strncmp(trans, "T", 1)==0);
    nounit = (strncmp(diag, "N", 1)==0);

/*     Set up the start point in X if the increment is not unity. This   
       will be  ( N - 1 )*INCX  too small for descending loops. */

    if (*incx <= 0) {
	kx = 1 - (*n - 1) * *incx;
    } else if (*incx != 1) {
	kx = 1;
    }

/*     Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */

    if (strncmp(trans, "N", 1)==0) {

/*        Form  x := inv( A )*x. */

	if (strncmp(uplo, "U", 1)==0) {
	    if (*incx == 1) {
		for (j = *n; j >= 1; --j) {
		    if (X(j).r != 0.f || X(j).i != 0.f) {
			if (nounit) {
			    c_div(&q__1, &X(j), &A(j,j));
			    X(j).r = q__1.r, X(j).i = q__1.i;
			}
			temp.r = X(j).r, temp.i = X(j).i;
			for (i = j - 1; i >= 1; --i) {
			    q__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    q__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    q__1.r = X(i).r - q__2.r, q__1.i = X(i).i - 
				    q__2.i;
			    X(i).r = q__1.r, X(i).i = q__1.i;
/* L10: */
			}
		    }
/* L20: */
		}
	    } else {
		jx = kx + (*n - 1) * *incx;
		for (j = *n; j >= 1; --j) {
		    if (X(jx).r != 0.f || X(jx).i != 0.f) {
			if (nounit) {
			    c_div(&q__1, &X(jx), &A(j,j));
			    X(jx).r = q__1.r, X(jx).i = q__1.i;
			}
			temp.r = X(jx).r, temp.i = X(jx).i;
			ix = jx;
			for (i = j - 1; i >= 1; --i) {
			    ix -= *incx;
			    q__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    q__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    q__1.r = X(ix).r - q__2.r, q__1.i = X(ix).i - 
				    q__2.i;
			    X(ix).r = q__1.r, X(ix).i = q__1.i;
/* L30: */
			}
		    }
		    jx -= *incx;
/* L40: */
		}
	    }
	} else {
	    if (*incx == 1) {
		for (j = 1; j <= *n; ++j) {
		    if (X(j).r != 0.f || X(j).i != 0.f) {
			if (nounit) {
			    c_div(&q__1, &X(j), &A(j,j));
			    X(j).r = q__1.r, X(j).i = q__1.i;
			}
			temp.r = X(j).r, temp.i = X(j).i;
			for (i = j + 1; i <= *n; ++i) {
			    q__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    q__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    q__1.r = X(i).r - q__2.r, q__1.i = X(i).i - 
				    q__2.i;
			    X(i).r = q__1.r, X(i).i = q__1.i;
/* L50: */
			}
		    }
/* L60: */
		}
	    } else {
		jx = kx;
		for (j = 1; j <= *n; ++j) {
		    if (X(jx).r != 0.f || X(jx).i != 0.f) {
			if (nounit) {
			    c_div(&q__1, &X(jx), &A(j,j));
			    X(jx).r = q__1.r, X(jx).i = q__1.i;
			}
			temp.r = X(jx).r, temp.i = X(jx).i;
			ix = jx;
			for (i = j + 1; i <= *n; ++i) {
			    ix += *incx;
			    q__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    q__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    q__1.r = X(ix).r - q__2.r, q__1.i = X(ix).i - 
				    q__2.i;
			    X(ix).r = q__1.r, X(ix).i = q__1.i;
/* L70: */
			}
		    }
		    jx += *incx;
/* L80: */
		}
	    }
	}
    } else {

/*        Form  x := inv( A' )*x  or  x := inv( conjg( A' ) )*x. */

	if (strncmp(uplo, "U", 1)==0) {
	    if (*incx == 1) {
		for (j = 1; j <= *n; ++j) {
		    temp.r = X(j).r, temp.i = X(j).i;
		    if (noconj) {
			for (i = 1; i <= j-1; ++i) {
			    q__2.r = A(i,j).r * X(i).r - A(i,j).i * X(
				    i).i, q__2.i = A(i,j).r * X(i).i + 
				    A(i,j).i * X(i).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
/* L90: */
			}
			if (nounit) {
			    c_div(&q__1, &temp, &A(j,j));
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    } else {
			for (i = 1; i <= j-1; ++i) {
			    r_cnjg(&q__3, &A(i,j));
			    q__2.r = q__3.r * X(i).r - q__3.i * X(i).i, 
				    q__2.i = q__3.r * X(i).i + q__3.i * X(
				    i).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
/* L100: */
			}
			if (nounit) {
			    r_cnjg(&q__2, &A(j,j));
			    c_div(&q__1, &temp, &q__2);
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    }
		    X(j).r = temp.r, X(j).i = temp.i;
/* L110: */
		}
	    } else {
		jx = kx;
		for (j = 1; j <= *n; ++j) {
		    ix = kx;
		    temp.r = X(jx).r, temp.i = X(jx).i;
		    if (noconj) {
			for (i = 1; i <= j-1; ++i) {
			    q__2.r = A(i,j).r * X(ix).r - A(i,j).i * X(
				    ix).i, q__2.i = A(i,j).r * X(ix).i + 
				    A(i,j).i * X(ix).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
			    ix += *incx;
/* L120: */
			}
			if (nounit) {
			    c_div(&q__1, &temp, &A(j,j));
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    } else {
			for (i = 1; i <= j-1; ++i) {
			    r_cnjg(&q__3, &A(i,j));
			    q__2.r = q__3.r * X(ix).r - q__3.i * X(ix).i, 
				    q__2.i = q__3.r * X(ix).i + q__3.i * X(
				    ix).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
			    ix += *incx;
/* L130: */
			}
			if (nounit) {
			    r_cnjg(&q__2, &A(j,j));
			    c_div(&q__1, &temp, &q__2);
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    }
		    X(jx).r = temp.r, X(jx).i = temp.i;
		    jx += *incx;
/* L140: */
		}
	    }
	} else {
	    if (*incx == 1) {
		for (j = *n; j >= 1; --j) {
		    temp.r = X(j).r, temp.i = X(j).i;
		    if (noconj) {
			for (i = *n; i >= j+1; --i) {
			    q__2.r = A(i,j).r * X(i).r - A(i,j).i * X(
				    i).i, q__2.i = A(i,j).r * X(i).i + 
				    A(i,j).i * X(i).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
/* L150: */
			}
			if (nounit) {
			    c_div(&q__1, &temp, &A(j,j));
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    } else {
			for (i = *n; i >= j+1; --i) {
			    r_cnjg(&q__3, &A(i,j));
			    q__2.r = q__3.r * X(i).r - q__3.i * X(i).i, 
				    q__2.i = q__3.r * X(i).i + q__3.i * X(
				    i).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
/* L160: */
			}
			if (nounit) {
			    r_cnjg(&q__2, &A(j,j));
			    c_div(&q__1, &temp, &q__2);
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    }
		    X(j).r = temp.r, X(j).i = temp.i;
/* L170: */
		}
	    } else {
		kx += (*n - 1) * *incx;
		jx = kx;
		for (j = *n; j >= 1; --j) {
		    ix = kx;
		    temp.r = X(jx).r, temp.i = X(jx).i;
		    if (noconj) {
			for (i = *n; i >= j+1; --i) {
			    q__2.r = A(i,j).r * X(ix).r - A(i,j).i * X(
				    ix).i, q__2.i = A(i,j).r * X(ix).i + 
				    A(i,j).i * X(ix).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
			    ix -= *incx;
/* L180: */
			}
			if (nounit) {
			    c_div(&q__1, &temp, &A(j,j));
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    } else {
			for (i = *n; i >= j+1; --i) {
			    r_cnjg(&q__3, &A(i,j));
			    q__2.r = q__3.r * X(ix).r - q__3.i * X(ix).i, 
				    q__2.i = q__3.r * X(ix).i + q__3.i * X(
				    ix).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
			    ix -= *incx;
/* L190: */
			}
			if (nounit) {
			    r_cnjg(&q__2, &A(j,j));
			    c_div(&q__1, &temp, &q__2);
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    }
		    X(jx).r = temp.r, X(jx).i = temp.i;
		    jx -= *incx;
/* L200: */
		}
	    }
	}
    }

    return;

/*     End of CTRSV . */

}